

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeglobpattern.cpp
# Opt level: O2

void __thiscall
QMimeGlobPatternList::match
          (QMimeGlobPatternList *this,QMimeGlobMatchResult *result,QString *fileName,
          AddMatchFilterFunc *filterFunc)

{
  bool bVar1;
  qsizetype qVar2;
  QMimeGlobPattern *this_00;
  long lVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_60;
  QStringView local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->super_QList<QMimeGlobPattern>).d.ptr;
  lVar3 = (this->super_QList<QMimeGlobPattern>).d.size << 6;
  do {
    if (lVar3 == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      __stack_chk_fail();
    }
    bVar1 = QMimeGlobPattern::matchFileName(this_00,fileName);
    if (bVar1) {
      bVar1 = std::function<bool_(const_QString_&)>::operator()(filterFunc,&this_00->m_mimeType);
      if (bVar1) {
        local_60.d = (this_00->m_pattern).d.d;
        local_60.ptr = (this_00->m_pattern).d.ptr;
        local_60.size = (this_00->m_pattern).d.size;
        if (local_60.d != (Data *)0x0) {
          LOCK();
          ((local_60.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_60.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_48.m_size = local_60.size;
        local_48.m_data = local_60.ptr;
        qVar2 = QStringView::lastIndexOf(&local_48,(QChar)0x2a,CaseSensitive);
        if (((qVar2 == 0) && (1 < local_48.m_size)) && (local_48.m_data[1] == L'.')) {
          bVar1 = QStringView::contains(&local_48,(QChar)0x3f,CaseSensitive);
          if (bVar1) goto LAB_004451dd;
          bVar1 = QStringView::contains(&local_48,(QChar)0x5b,CaseSensitive);
          if (bVar1) goto LAB_004451dd;
          qVar2 = local_60.size + -2;
        }
        else {
LAB_004451dd:
          qVar2 = 0;
        }
        QMimeGlobMatchResult::addMatch
                  (result,&this_00->m_mimeType,this_00->m_weight,(QString *)&local_60,qVar2);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
      }
    }
    this_00 = this_00 + 1;
    lVar3 = lVar3 + -0x40;
  } while( true );
}

Assistant:

void QMimeGlobPatternList::match(QMimeGlobMatchResult &result, const QString &fileName,
                                 const AddMatchFilterFunc &filterFunc) const
{
    for (const QMimeGlobPattern &glob : *this) {
        if (glob.matchFileName(fileName) && filterFunc(glob.mimeType())) {
            const QString pattern = glob.pattern();
            const qsizetype suffixLen = isSimplePattern(pattern) ? pattern.size() - strlen("*.") : 0;
            result.addMatch(glob.mimeType(), glob.weight(), pattern, suffixLen);
        }
    }
}